

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.h
# Opt level: O0

char * __thiscall cppcms::impl::cgi::connection::getenv_abi_cxx11_(connection *this,char *__name)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  pointer peVar4;
  iterator iVar5;
  iterator p;
  iterator *in_stack_fffffffffffffef8;
  mapped_type *in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  allocator local_a9;
  string local_a8 [32];
  vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
  *local_88;
  int local_80;
  vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
  *local_78;
  int local_70;
  vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
  *local_68;
  int local_60;
  vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
  *local_58;
  int local_50;
  vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
  *local_48;
  int local_40;
  vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
  *local_38;
  int local_30;
  vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
  *local_28;
  int local_20;
  vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
  *local_18;
  int local_10;
  connection *local_8;
  
  local_8 = this;
  bVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x161bf8);
  in_stack_ffffffffffffff40 = in_stack_ffffffffffffff40 & 0xffffff;
  if (bVar3) {
    iVar5 = string_map::begin((string_map *)0x161c1d);
    local_28 = iVar5.d;
    local_20 = iVar5.current_;
    local_18 = local_28;
    local_10 = local_20;
    iVar5 = string_map::end((string_map *)0x161c54);
    local_48 = iVar5.d;
    local_40 = iVar5.current_;
    local_38 = local_48;
    local_30 = local_40;
    bVar3 = booster::
            iterator_facade<cppcms::impl::string_map::iterator,_cppcms::impl::string_map::entry,_booster::forward_traversal_tag,_cppcms::impl::string_map::entry_&,_long>
            ::operator!=((iterator_facade<cppcms::impl::string_map::iterator,_cppcms::impl::string_map::entry,_booster::forward_traversal_tag,_cppcms::impl::string_map::entry_&,_long>
                          *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    in_stack_ffffffffffffff40 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffff40);
  }
  if ((char)(in_stack_ffffffffffffff40 >> 0x18) != '\0') {
    iVar5 = string_map::begin((string_map *)0x161cb5);
    local_68 = iVar5.d;
    local_60 = iVar5.current_;
    local_58 = local_68;
    local_50 = local_60;
    while( true ) {
      iVar5 = string_map::end((string_map *)0x161cf0);
      local_88 = iVar5.d;
      local_80 = iVar5.current_;
      local_78 = local_88;
      local_70 = local_80;
      bVar3 = booster::
              iterator_facade<cppcms::impl::string_map::iterator,_cppcms::impl::string_map::entry,_booster::forward_traversal_tag,_cppcms::impl::string_map::entry_&,_long>
              ::operator!=((iterator_facade<cppcms::impl::string_map::iterator,_cppcms::impl::string_map::entry,_booster::forward_traversal_tag,_cppcms::impl::string_map::entry_&,_long>
                            *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      if (!bVar3) break;
      peVar4 = booster::
               iterator_facade<cppcms::impl::string_map::iterator,_cppcms::impl::string_map::entry,_booster::forward_traversal_tag,_cppcms::impl::string_map::entry_&,_long>
               ::operator->((iterator_facade<cppcms::impl::string_map::iterator,_cppcms::impl::string_map::entry,_booster::forward_traversal_tag,_cppcms::impl::string_map::entry_&,_long>
                             *)0x161d4d);
      pcVar1 = peVar4->value;
      peVar4 = booster::
               iterator_facade<cppcms::impl::string_map::iterator,_cppcms::impl::string_map::entry,_booster::forward_traversal_tag,_cppcms::impl::string_map::entry_&,_long>
               ::operator->((iterator_facade<cppcms::impl::string_map::iterator,_cppcms::impl::string_map::entry,_booster::forward_traversal_tag,_cppcms::impl::string_map::entry_&,_long>
                             *)0x161d73);
      pcVar2 = peVar4->key;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,pcVar2,&local_a9);
      in_stack_ffffffffffffff00 =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (key_type *)this);
      std::__cxx11::string::operator=((string *)in_stack_ffffffffffffff00,pcVar1);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      booster::
      iterator_facade<cppcms::impl::string_map::iterator,_cppcms::impl::string_map::entry,_booster::forward_traversal_tag,_cppcms::impl::string_map::entry_&,_long>
      ::operator++((iterator_facade<cppcms::impl::string_map::iterator,_cppcms::impl::string_map::entry,_booster::forward_traversal_tag,_cppcms::impl::string_map::entry_&,_long>
                    *)in_stack_ffffffffffffff00);
    }
  }
  return (char *)((long)this + 0xc0);
}

Assistant:

virtual std::map<std::string,std::string> const &getenv()
		{
			if(map_env_.empty() && env_.begin()!=env_.end()) {
				for(string_map::iterator p=env_.begin();p!=env_.end();++p) {
					map_env_[p->key]=p->value;
				}
			}
			return map_env_;
		}